

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream *dctx,ZSTD_DDict *ddict)

{
  size_t sVar1;
  
  dctx->streamStage = zdss_init;
  dctx->noForwardProgress = 0;
  sVar1 = ZSTD_DCtx_refDDict(dctx,ddict);
  if (sVar1 < 0xffffffffffffff89) {
    if (ZSTD_f_zstd1_magicless < dctx->format) {
      __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9c36,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
    }
    sVar1 = (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_DCtx_refDDict(dctx, ddict) , "");
    return ZSTD_startingInputLength(dctx->format);
}